

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

int __thiscall CNscPStackEntry::GetInteger(CNscPStackEntry *this)

{
  long lVar1;
  long in_RDI;
  NscPCodeConstantInteger *p;
  
  if (*(int *)(in_RDI + 0x10) != 6) {
    __assert_fail("m_nType == NscType_Integer",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x141,"int CNscPStackEntry::GetInteger() const");
  }
  lVar1 = *(long *)(in_RDI + 0x70);
  if (*(int *)(lVar1 + 8) == 0x34) {
    if (*(int *)(lVar1 + 0xc) == 6) {
      return *(int *)(lVar1 + 0x10);
    }
    __assert_fail("p ->nType == NscType_Integer",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x145,"int CNscPStackEntry::GetInteger() const");
  }
  __assert_fail("p ->nOpCode == NscPCode_Constant",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0x144,"int CNscPStackEntry::GetInteger() const");
}

Assistant:

int GetInteger () const
	{
		assert (m_nType == NscType_Integer);
//		assert (m_nDataSize == sizeof (NscPCodeConstantInteger)); // Negative numbers in case statements have a size of 28
		NscPCodeConstantInteger *p = (NscPCodeConstantInteger *) m_pauchData;
		assert (p ->nOpCode == NscPCode_Constant);
		assert (p ->nType == NscType_Integer);
		return p ->lValue;
	}